

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O2

void __thiscall mp::SPAdapter::SPAdapter(SPAdapter *this,ColProblem *p)

{
  pointer ppIVar1;
  Impl *pIVar2;
  ColProblem *pCVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  int iVar6;
  BasicSuffix<int> stage_suffix;
  pointer piVar7;
  int *piVar8;
  pointer piVar9;
  int i;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  StringRef name;
  allocator_type local_91;
  ColProblem *local_90;
  vector<int,_std::allocator<int>_> *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  *local_68;
  LinearExpr *local_60;
  vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_> *local_58;
  ExprFactory *local_50;
  vector<int,_std::allocator<int>_> stage_offsets;
  
  this->problem_ = p;
  local_50 = &this->factory_;
  (this->factory_)._vptr_BasicExprFactory = (_func_int **)&PTR__BasicExprFactory_001867b8;
  local_58 = &this->random_vars_;
  local_80 = &this->var_core2orig_;
  local_78 = &this->var_orig2core_;
  uVar11 = 0;
  memset(&(this->factory_).exprs_,0,0x140);
  this->num_stages_ = 1;
  local_88 = &this->num_stage_vars_;
  local_60 = &this->linear_obj_;
  (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->linear_obj_).terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
  m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity = 6;
  (this->linear_obj_).terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
  m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)&(this->linear_obj_).terms_.
             super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.m_storage;
  (this->linear_obj_).terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
  m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_size = 0;
  local_68 = &this->nonlinear_objs_;
  (this->nonlinear_objs_).
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nonlinear_objs_).
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nonlinear_objs_).
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppIVar1 = (p->super_Problem).super_ExprFactory.funcs_.
            super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (ulong)((long)(p->super_Problem).super_ExprFactory.funcs_.
                         super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3;
  local_90 = p;
  uVar13 = uVar12 & 0xffffffff;
  if ((int)uVar12 < 1) {
    uVar13 = uVar11;
  }
  do {
    if (uVar13 == uVar11) goto LAB_0014c48a;
    pIVar2 = ppIVar1[uVar11];
    iVar6 = strcmp(pIVar2->name,"random");
    uVar11 = uVar11 + 1;
  } while (iVar6 != 0);
  (this->random_).impl_ = pIVar2;
LAB_0014c48a:
  pvVar5 = local_78;
  pvVar4 = local_88;
  pCVar3 = local_90;
  GetRandomVectors(this,&local_90->super_Problem);
  name.size_ = 5;
  name.data_ = "stage";
  stage_suffix = BasicSuffixSet<std::allocator<char>_>::Find<int>
                           ((pCVar3->super_Problem).super_SuffixManager.suffixes_,name);
  if (stage_suffix.super_SuffixBase.impl_ == (Impl *)0x0) {
    uVar12 = (ulong)((long)(this->problem_->super_Problem).vars_.
                           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->problem_->super_Problem).vars_.
                          super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4;
    uVar11 = 0;
    uVar13 = uVar12 & 0xffffffff;
    if ((int)uVar12 < 1) {
      uVar13 = uVar11;
    }
    for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
      if ((pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar11] == 0) {
        piVar8 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(this->num_stage_vars_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar8) >> 2) < 1) {
          std::vector<int,_std::allocator<int>_>::resize(pvVar4,1);
          piVar8 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        *piVar8 = *piVar8 + 1;
      }
    }
  }
  else {
    GetVarStages<mp::BasicSuffix<int>>(this,stage_suffix);
  }
  pCVar3 = local_90;
  piVar9 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar9 == piVar7) {
    std::vector<int,_std::allocator<int>_>::resize(pvVar4,1);
    piVar9 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  pvVar4 = local_80;
  this->num_stages_ = (int)((ulong)((long)piVar7 - (long)piVar9) >> 2);
  uVar13 = (ulong)((long)(pCVar3->super_Problem).vars_.
                         super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar3->super_Problem).vars_.
                        super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 4;
  iVar6 = (int)uVar13;
  std::vector<int,_std::allocator<int>_>::resize
            (local_80,(long)iVar6 +
                      ((long)(this->random_vars_).
                             super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->random_vars_).
                            super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start) / -0xc);
  std::vector<int,_std::allocator<int>_>::vector(&stage_offsets,(long)this->num_stages_,&local_91);
  piVar9 = (local_88->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  for (lVar10 = 1; lVar10 < this->num_stages_; lVar10 = lVar10 + 1) {
    stage_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar10] =
         piVar9[lVar10 + -1] +
         stage_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start[lVar10 + -1];
  }
  piVar9 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar7 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar11 = 0;
  uVar13 = uVar13 & 0xffffffff;
  if (iVar6 < 1) {
    uVar13 = uVar11;
  }
  for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
    lVar10 = (long)piVar9[uVar11];
    if (-1 < lVar10) {
      iVar6 = stage_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      stage_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = iVar6 + 1;
      piVar7[iVar6] = (int)uVar11;
      piVar9[uVar11] = iVar6;
    }
  }
  ProcessObjs(this);
  ProcessCons(this);
  if (1 < this->num_stages_) {
    ExtractRandomTerms(this);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&stage_offsets.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

SPAdapter::SPAdapter(const ColProblem &p): problem_(p), num_stages_(1) {
  // Find the random function.
  for (int i = 0, n = p.num_functions(); i < n; ++i) {
    auto function = p.function(i);
    if (std::strcmp(function.name(), "random") == 0) {
      random_ = function;
      break;
    }
  }

  GetRandomVectors(p);

  // Reorder variables by stages.
  if (IntSuffix stage_suffix = p.suffixes(suf::VAR).Find<int>("stage"))
    GetVarStages(stage_suffix);
  else
    GetVarStages(NullSuffix());
  if (num_stage_vars_.empty())
    num_stage_vars_.resize(1);
  num_stages_ = static_cast<int>(num_stage_vars_.size());
  int num_vars = p.num_vars();
  var_core2orig_.resize(num_vars - random_vars_.size());
  std::vector<int> stage_offsets(num_stages_);
  for (int i = 1; i < num_stages_; ++i)
    stage_offsets[i] = stage_offsets[i - 1] + num_stage_vars_[i - 1];
  for (int i = 0; i < num_vars; ++i) {
    int stage = var_orig2core_[i];
    if (stage < 0)
      continue;  // Skip random variables.
    int core_var_index = stage_offsets[stage]++;
    var_core2orig_[core_var_index] = i;
    var_orig2core_[i] = core_var_index;
  }

  ProcessObjs();
  ProcessCons();
  if (num_stages_ > 1)
    ExtractRandomTerms();
}